

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout_p.h
# Opt level: O0

bool __thiscall
QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout>::startSeparatorMove
          (QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout> *this,QPoint *pos)

{
  long lVar1;
  QPoint *in_RSI;
  QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout> *in_RDI;
  long in_FS_OFFSET;
  QDockAreaLayoutInfo *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  bool local_21;
  QPoint *in_stack_ffffffffffffffe0;
  QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout> *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  findSeparator(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  QList<int>::operator=
            ((QList<int> *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
             (QList<int> *)in_stack_ffffffffffffffa8);
  QList<int>::~QList((QList<int> *)0x604606);
  local_21 = QList<int>::isEmpty((QList<int> *)0x604614);
  if (!local_21) {
    layout(in_RDI);
    layout(in_RDI);
    QDockAreaLayoutInfo::operator=
              ((QDockAreaLayoutInfo *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffa8);
    in_RDI->movingSeparatorOrigin = *in_RSI;
    in_RDI->movingSeparatorPos = in_RDI->movingSeparatorOrigin;
  }
  local_21 = !local_21;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_21;
}

Assistant:

bool QMainWindowLayoutSeparatorHelper<Layout>::startSeparatorMove(const QPoint &pos)
{
    movingSeparator = findSeparator(pos);

    if (movingSeparator.isEmpty())
        return false;

    layout()->savedState = layout()->layoutState;
    movingSeparatorPos = movingSeparatorOrigin = pos;

    return true;
}